

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O2

void __thiscall
ot::commissioner::FileLogger::Log(FileLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  stringstream logStream;
  string local_200;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [16];
  undefined8 local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::mutex::lock(&this->mLogMutex);
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((aLevel <= this->mLogLevel) && (this->mLogFile != (FILE *)0x0)) {
    poVar1 = std::operator<<(local_1a8,"[ ");
    auVar2 = std::chrono::_V2::system_clock::now();
    local_1c0 = auVar2._0_8_;
    TimePointToString_abi_cxx11_(&local_200,(commissioner *)&local_1c0,auVar2._8_8_);
    poVar1 = std::operator<<(poVar1,(string *)&local_200);
    poVar1 = std::operator<<(poVar1," ] ");
    local_1e0 = local_1d0;
    local_1d8 = 0;
    local_1d0[0] = 0;
    if (kDebug < aLevel) {
      abort();
    }
    std::__cxx11::string::assign((char *)&local_1e0);
    poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
    poVar1 = std::operator<<(poVar1," [ ");
    poVar1 = std::operator<<(poVar1,(string *)aRegion);
    poVar1 = std::operator<<(poVar1," ] ");
    poVar1 = std::operator<<(poVar1,(string *)aMsg);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::stringbuf::str();
    fputs(local_200._M_dataplus._M_p,(FILE *)this->mLogFile);
    std::__cxx11::string::~string((string *)&local_200);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mLogMutex);
  return;
}

Assistant:

void FileLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    std::lock_guard<std::mutex> _(mLogMutex);
    std::stringstream           logStream;

    VerifyOrExit(aLevel <= mLogLevel);
    VerifyOrExit(mLogFile != nullptr);

    logStream << "[ " << TimePointToString(Clock::now()) << " ] " << ToString(aLevel) << " [ " << aRegion << " ] "
              << aMsg << std::endl;
    fputs(logStream.str().c_str(), mLogFile);

exit:
    return;
}